

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_test.cc
# Opt level: O3

void __thiscall
writer_test_should_write_bool_field_Test::TestBody(writer_test_should_write_bool_field_Test *this)

{
  bool bVar1;
  size_t __n;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t __n_00;
  char *pcVar2;
  ostringstream local_1d8 [8];
  ostringstream oss;
  ios_base local_168 [264];
  internal local_60 [8];
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  undefined2 local_2a;
  AssertHelper local_28;
  
  local_2a = 1;
  std::__cxx11::ostringstream::ostringstream(local_1d8);
  Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<43U,_Fixpp::Type::Boolean>_>_>::write
            ((int)local_1d8,&local_2a,__n);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
            (local_60,"oss.str()","\"43=Y|\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
             ,(char (*) [6])"43=Y|");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar.message_.ptr_ != &local_40) {
    operator_delete(gtest_ar.message_.ptr_,local_40._M_allocated_capacity + 1);
  }
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/writer_test.cc"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar.message_,"","");
    std::__cxx11::stringbuf::str((string *)&oss);
    __n_00 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)gtest_ar.message_.ptr_ != &local_40) {
      operator_delete(gtest_ar.message_.ptr_,local_40._M_allocated_capacity + 1);
      __n_00 = extraout_RDX_00;
    }
    local_2a = 0;
    Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<43U,_Fixpp::Type::Boolean>_>_>::write
              ((int)local_1d8,&local_2a,__n_00);
    std::__cxx11::stringbuf::str();
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
              (local_60,"oss.str()","\"43=N|\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &gtest_ar.message_,(char (*) [6])"43=N|");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)gtest_ar.message_.ptr_ != &local_40) {
      operator_delete(gtest_ar.message_.ptr_,local_40._M_allocated_capacity + 1);
    }
    if (local_60[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      if (gtest_ar._0_8_ != 0) {
        pcVar2 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/writer_test.cc"
                 ,0x50,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1d8);
  std::ios_base::~ios_base(local_168);
  return;
}

Assistant:

TEST(writer_test, should_write_bool_field)
{
    using Field = Fixpp::Field<Fixpp::Tag::PossDupFlag>;
    Field field;
    field.set(true);

    std::ostringstream oss;
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "43=Y|");

    oss.str("");

    field.set(false);
    Fixpp::details::FieldWriter<Field>::write(oss, field);

    ASSERT_EQ(oss.str(), "43=N|");
}